

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  U32 *pUVar7;
  ulong srcSize;
  void *pvVar8;
  U32 *pUVar9;
  uint matchlengthMaxValue;
  uint offcodeMaxValue;
  size_t local_110;
  ZSTD_matchState_t *local_108;
  uint matchlengthLog;
  size_t local_f8;
  ZSTD_CCtx_params *local_f0;
  uint maxSymbolValue;
  short offcodeNCount [32];
  
  if (8 < dictSize && dict != (void *)0x0) {
    local_108 = ms;
    ZSTD_reset_compressedBlockState(bs);
    if (dictContentType != ZSTD_dct_rawContent) {
      if (*dict == -0x13cf5bc9) {
LAB_001807e3:
        offcodeMaxValue = 0x1f;
        if ((params->fParams).noDictIDFlag == 0) {
          local_f8 = (size_t)*(uint *)((long)dict + 4);
        }
        else {
          local_f8 = 0;
        }
        maxSymbolValue = 0xff;
        local_f0 = params;
        sVar4 = HUF_readCTable((HUF_CElt *)bs,&maxSymbolValue,(void *)((long)dict + 8),dictSize - 8)
        ;
        uVar1 = HUF_isError(sVar4);
        if (maxSymbolValue < 0xff || uVar1 != 0) {
          return 0xffffffffffffffe2;
        }
        pUVar7 = (U32 *)(dictSize + (long)dict);
        pvVar8 = (void *)((long)dict + sVar4 + 8);
        sVar4 = FSE_readNCount(offcodeNCount,&offcodeMaxValue,&maxSymbolValue,pvVar8,
                               (long)pUVar7 - (long)pvVar8);
        uVar1 = FSE_isError(sVar4);
        if (uVar1 != 0) {
          return 0xffffffffffffffe2;
        }
        if (8 < maxSymbolValue) {
          return 0xffffffffffffffe2;
        }
        sVar5 = FSE_buildCTable_wksp
                          ((bs->entropy).offcodeCTable,offcodeNCount,0x1f,maxSymbolValue,workspace,
                           0x1800);
        if (0xffffffffffffff88 < sVar5) {
          return 0xffffffffffffffe2;
        }
        pvVar8 = (void *)((long)pvVar8 + sVar4);
        matchlengthMaxValue = 0x34;
        sVar4 = FSE_readNCount((short *)&maxSymbolValue,&matchlengthMaxValue,&matchlengthLog,pvVar8,
                               (long)pUVar7 - (long)pvVar8);
        uVar2 = FSE_isError(sVar4);
        uVar3 = matchlengthLog;
        uVar1 = matchlengthMaxValue;
        if (matchlengthLog < 10 && uVar2 == 0) {
          local_110 = sVar4;
          sVar4 = ZSTD_checkDictNCount((short *)&maxSymbolValue,matchlengthMaxValue,0x34);
          if (0xffffffffffffff88 < sVar4) {
            return sVar4;
          }
          sVar4 = FSE_buildCTable_wksp
                            ((bs->entropy).matchlengthCTable,(short *)&maxSymbolValue,uVar1,uVar3,
                             workspace,0x1800);
          if (sVar4 < 0xffffffffffffff89) {
            pvVar8 = (void *)((long)pvVar8 + local_110);
            matchlengthMaxValue = 0x23;
            sVar4 = FSE_readNCount((short *)&maxSymbolValue,&matchlengthMaxValue,&matchlengthLog,
                                   pvVar8,(long)pUVar7 - (long)pvVar8);
            uVar3 = FSE_isError(sVar4);
            uVar1 = matchlengthMaxValue;
            if (matchlengthLog < 10 && uVar3 == 0) {
              local_110 = sVar4;
              sVar4 = ZSTD_checkDictNCount((short *)&maxSymbolValue,matchlengthMaxValue,0x23);
              if (0xffffffffffffff88 < sVar4) {
                return sVar4;
              }
              sVar4 = FSE_buildCTable_wksp
                                ((bs->entropy).litlengthCTable,(short *)&maxSymbolValue,uVar1,
                                 matchlengthLog,workspace,0x1800);
              if (0xffffffffffffff88 < sVar4) {
                return 0xffffffffffffffe2;
              }
              pUVar9 = (U32 *)((long)pvVar8 + local_110);
              src = pUVar9 + 3;
              if (pUVar7 < src) {
                return 0xffffffffffffffe2;
              }
              bs->rep[0] = *pUVar9;
              bs->rep[1] = pUVar9[1];
              bs->rep[2] = pUVar9[2];
              srcSize = (long)pUVar7 - (long)src;
              uVar3 = (int)srcSize + 0x20000;
              uVar1 = 0x1f;
              if (uVar3 != 0) {
                for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
                }
              }
              uVar3 = 0x1f;
              if (srcSize >> 0x11 < 0x7fff) {
                uVar3 = uVar1;
              }
              sVar4 = ZSTD_checkDictNCount(offcodeNCount,offcodeMaxValue,uVar3);
              if (0xffffffffffffff88 < sVar4) {
                return sVar4;
              }
              lVar6 = 0;
              do {
                if (lVar6 == 3) {
                  (bs->entropy).hufCTable_repeatMode = HUF_repeat_valid;
                  (bs->entropy).offcode_repeatMode = FSE_repeat_valid;
                  (bs->entropy).matchlength_repeatMode = FSE_repeat_valid;
                  (bs->entropy).litlength_repeatMode = FSE_repeat_valid;
                  ZSTD_loadDictionaryContent(local_108,local_f0,src,srcSize,dtlm);
                  return local_f8;
                }
                pUVar7 = bs->rep + lVar6;
              } while (((ulong)*pUVar7 != 0) && (lVar6 = lVar6 + 1, *pUVar7 <= srcSize));
            }
          }
        }
        return 0xffffffffffffffe2;
      }
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe0;
      }
      if (dictContentType != ZSTD_dct_auto) goto LAB_001807e3;
    }
    ZSTD_loadDictionaryContent(local_108,params,dict,dictSize,dtlm);
  }
  return 0;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}